

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O1

SampleBuilder * __thiscall tcu::SampleBuilder::operator<<(SampleBuilder *this,int v)

{
  pointer *ppVVar1;
  iterator __position;
  Value local_18;
  
  local_18.value = (anon_union_8_2_07d0b834_for_value)(long)v;
  local_18.type = TYPE_INT64;
  __position._M_current =
       (this->m_values).
       super__Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_values).
      super__Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
    _M_realloc_insert<tcu::SampleBuilder::Value>(&this->m_values,__position,&local_18);
  }
  else {
    *(ulong *)__position._M_current = (ulong)(uint)local_18._4_4_ << 0x20;
    (__position._M_current)->value = local_18.value;
    ppVVar1 = &(this->m_values).
               super__Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return this;
}

Assistant:

SampleBuilder&			operator<<			(int v)		{ m_values.push_back(Value((deInt64)v));	return *this; }